

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Frames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  Abc_Frame_t *pAbc_00;
  int iVar3;
  uint nFanMax;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  Gia_ParFra_t Pars;
  Gia_ParFra_t local_50;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Gia_ManFraSetDefaultParams(&local_50);
  nFanMax = 0;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        while (iVar3 = Extra_UtilGetopt(argc,argv,"FLsoibavh"), pAbc_00 = local_38,
              iVar7 = globalUtilOptind, 0x68 < iVar3) {
          if (iVar3 < 0x73) {
            if (iVar3 == 0x69) {
              local_50.fInit = local_50.fInit ^ 1;
            }
            else {
              if (iVar3 != 0x6f) goto LAB_0027c3ee;
              local_50.fOrPos = local_50.fOrPos ^ 1;
            }
          }
          else if (iVar3 == 0x73) {
            local_50.fDisableSt = local_50.fDisableSt ^ 1;
          }
          else {
            if (iVar3 != 0x76) goto LAB_0027c3ee;
            local_50.fVerbose = local_50.fVerbose ^ 1;
          }
        }
        if (iVar3 < 0x61) break;
        if (iVar3 == 0x61) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else {
          if (iVar3 != 0x62) goto LAB_0027c3ee;
          bVar1 = (bool)(bVar1 ^ 1);
        }
      }
      if (iVar3 == 0x46) break;
      if (iVar3 != 0x4c) {
        if (iVar3 == -1) {
          pGVar4 = local_38->pGia;
          if (pGVar4 != (Gia_Man_t *)0x0) {
            if (pGVar4->nRegs != 0) {
              if (bVar1) {
                pGVar4 = Gia_ManFramesInitSpecial(pGVar4,local_50.nFrames,local_50.fVerbose);
              }
              else if (nFanMax == 0) {
                if (bVar2) {
                  pGVar4 = Gia_ManFrames2(pGVar4,&local_50);
                }
                else {
                  pGVar4 = Gia_ManFrames(pGVar4,&local_50);
                }
              }
              else {
                pGVar4 = Gia_ManUnrollAndCofactor(pGVar4,local_50.nFrames,nFanMax,local_50.fVerbose)
                ;
              }
              Abc_FrameUpdateGia(pAbc_00,pGVar4);
              return 0;
            }
            Abc_Print(-1,"The network is combinational.\n");
            return 0;
          }
          pcVar5 = "Abc_CommandAbc9Frames(): There is no AIG.\n";
          iVar7 = -1;
          goto LAB_0027c513;
        }
        goto LAB_0027c3ee;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_0027c3e2:
        Abc_Print(-1,pcVar5);
        goto LAB_0027c3ee;
      }
      nFanMax = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar7 + 1;
      if ((int)nFanMax < 0) goto LAB_0027c3ee;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_0027c3e2;
    }
    local_50.nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar7 + 1;
  } while (-1 < local_50.nFrames);
LAB_0027c3ee:
  Abc_Print(-2,"usage: &frames [-FL <num>] [-soibavh]\n");
  Abc_Print(-2,"\t         unrolls the design for several timeframes\n");
  Abc_Print(-2,"\t-F num : the number of frames to unroll [default = %d]\n",
            (ulong)(uint)local_50.nFrames);
  Abc_Print(-2,"\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n"
            ,(ulong)nFanMax);
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (local_50.fDisableSt == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle disabling structural hashing [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_50.fOrPos == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-o     : toggle ORing corresponding POs [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_50.fInit == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-i     : toggle initializing registers [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-b     : toggle computing special AIG for BMC [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (!bVar2) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle using new algorithm [default = %s]\n",pcVar5);
  if (local_50.fVerbose == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
  pcVar5 = "\t-h     : print the command usage\n";
  iVar7 = -2;
LAB_0027c513:
  Abc_Print(iVar7,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9Frames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFrames2( Gia_Man_t * pAig, Gia_ParFra_t * pPars );

    Gia_Man_t * pTemp;
    Gia_ParFra_t Pars, * pPars = &Pars;
    int c;
    int nCofFanLit = 0;
    int fNewAlgo = 0;
    int fInitSpecial = 0;
    Gia_ManFraSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FLsoibavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofFanLit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofFanLit < 0 )
                goto usage;
            break;
        case 's':
            pPars->fDisableSt ^= 1;
            break;
        case 'o':
            pPars->fOrPos ^= 1;
            break;
        case 'i':
            pPars->fInit ^= 1;
            break;
        case 'b':
            fInitSpecial ^= 1;
            break;
        case 'a':
            fNewAlgo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Frames(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( fInitSpecial )
        pTemp = Gia_ManFramesInitSpecial( pAbc->pGia, pPars->nFrames, pPars->fVerbose );
    else if ( nCofFanLit )
        pTemp = Gia_ManUnrollAndCofactor( pAbc->pGia, pPars->nFrames, nCofFanLit, pPars->fVerbose );
    else if ( fNewAlgo )
        pTemp = Gia_ManFrames2( pAbc->pGia, pPars );
    else
        pTemp = Gia_ManFrames( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &frames [-FL <num>] [-soibavh]\n" );
    Abc_Print( -2, "\t         unrolls the design for several timeframes\n" );
    Abc_Print( -2, "\t-F num : the number of frames to unroll [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n", nCofFanLit );
    Abc_Print( -2, "\t-s     : toggle disabling structural hashing [default = %s]\n", pPars->fDisableSt? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle ORing corresponding POs [default = %s]\n", pPars->fOrPos? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle initializing registers [default = %s]\n", pPars->fInit? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle computing special AIG for BMC [default = %s]\n", fInitSpecial? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}